

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void heap_init(long n)

{
  undefined1 auVar1 [16];
  long *plVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  allocate_heap(n);
  auVar1 = _DAT_0016c6c0;
  _heap_size = 0;
  if (0 < n) {
    uVar3 = n + 1U & 0xfffffffffffffffe;
    lVar4 = n + -1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    plVar2 = &_heap[1].idx;
    auVar5 = auVar5 ^ _DAT_0016c6c0;
    auVar6 = _DAT_0016c6b0;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        plVar2[-3] = 0;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        *plVar2 = 0;
      }
      lVar4 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar4 + 2;
      plVar2 = plVar2 + 6;
      uVar3 = uVar3 - 2;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void  heap_init( long  n )
{
  register long  p;

  allocate_heap( n );
  _heap_size = 0;
  for( p = 0;  p < n;  p++ )
  { 
    heap_idx( p ) = 0;
  }
 
}